

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,BamAlignment *alignment,string *dna,string *qualities,
          string *nucigar,vector<char,_std::allocator<char>_> *cigar_temp_unrolled,int *c_pos1,
          int *c_pos2,int *q_pos1,int *q_pos2,int *ref_pos)

{
  byte bVar1;
  byte bVar2;
  int *piVar3;
  char cVar4;
  bool bVar7;
  bool bVar8;
  char cVar5;
  char cVar6;
  
  bVar1 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[*c_pos1];
  bVar2 = (cigar_temp_unrolled->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
          super__Vector_impl_data._M_start[*c_pos2];
  cVar4 = (char)nucigar;
  cVar5 = (char)dna;
  cVar6 = (char)qualities;
  if (bVar2 == 0x4d && bVar1 == 0x4d) {
LAB_00172377:
    ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
    ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
    std::__cxx11::string::push_back(cVar5);
    std::__cxx11::string::push_back(cVar6);
    std::__cxx11::string::push_back(cVar4);
    if (bVar1 != 0x49) {
LAB_0017250e:
      *ref_pos = *ref_pos + 1;
    }
    *q_pos1 = *q_pos1 + 1;
    *q_pos2 = *q_pos2 + 1;
    *c_pos1 = *c_pos1 + 1;
    goto LAB_0017251b;
  }
  if ((bVar1 == 0x53) && (bVar2 == 0x53)) goto LAB_0017250e;
  if ((bVar1 == 0x49) && (bVar2 == 0x49)) goto LAB_00172377;
  if ((bVar1 == 0x44) && (bVar2 == 0x44)) {
LAB_00172431:
    *c_pos1 = *c_pos1 + 1;
    *c_pos2 = *c_pos2 + 1;
    *ref_pos = *ref_pos + 1;
    if ((bVar1 == 0x44) || (bVar2 == 0x44)) {
      std::__cxx11::string::push_back(cVar4);
    }
    c_pos2 = q_pos1;
    piVar3 = q_pos2;
    if (bVar1 == 0x53) goto LAB_0017251b;
  }
  else {
    bVar7 = bVar1 == 0x44;
    bVar8 = bVar1 == 0x48;
    if (((bVar8 || bVar7) && bVar2 == 0x48) ||
       (((bVar8 && bVar2 == 0x44 || (bVar7 && bVar2 == 0x53)) || (bVar1 == 0x53 && bVar2 == 0x44))))
    goto LAB_00172431;
    if (bVar1 == 0x4d) {
      if (((0xf < bVar2 - 0x44) || ((0x8011U >> (bVar2 - 0x44 & 0x1f) & 1) == 0)) &&
         ((!bVar8 && !bVar7 || (bVar2 != 0x4d)))) goto LAB_00172668;
      std::__cxx11::string::push_back(cVar4);
      ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
      std::__cxx11::string::push_back(cVar5);
      ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
      std::__cxx11::string::push_back(cVar6);
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos1 = *q_pos1 + 1;
      piVar3 = q_pos2;
    }
    else {
      if ((((!bVar8 && !bVar7) && bVar1 != 0x53 || bVar2 != 0x4d) &&
          (bVar1 != 0x53 || bVar2 != 0x48)) && (bVar2 != 0x53 || bVar1 != 0x48)) {
LAB_00172668:
        if ((bVar1 != 0x49) && (bVar2 != 0x49)) {
          return;
        }
        std::__cxx11::string::push_back(cVar4);
        if (bVar1 == 0x49) {
          ShortDnaSequence::operator[](&this->sequence1,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar5);
          ShortDnaSequence::qualityChar(&this->sequence1,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar6);
          *c_pos1 = *c_pos1 + 1;
          c_pos2 = q_pos1;
        }
        else {
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::push_back(cVar6);
          *c_pos2 = *c_pos2 + 1;
          c_pos2 = q_pos2;
        }
        goto LAB_0017251b;
      }
      if (bVar2 != 0x4d) {
        *ref_pos = *ref_pos + 1;
        *c_pos1 = *c_pos1 + 1;
        *c_pos2 = *c_pos2 + 1;
        c_pos2 = q_pos2;
        if (bVar1 == 0x53) {
          c_pos2 = q_pos1;
        }
        goto LAB_0017251b;
      }
      std::__cxx11::string::push_back(cVar4);
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::push_back(cVar6);
      *ref_pos = *ref_pos + 1;
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      *q_pos2 = *q_pos2 + 1;
      piVar3 = q_pos1;
      bVar2 = bVar1;
    }
  }
  c_pos2 = piVar3;
  if (bVar2 != 0x53) {
    return;
  }
LAB_0017251b:
  *c_pos2 = *c_pos2 + 1;
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(const BamTools::BamAlignment& alignment, std::string& dna, std::string& qualities, std::string& nucigar, std::vector<char>& cigar_temp_unrolled, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos) const{
    char c1 = this->cigar1_unrolled[c_pos1];
    char c2 = cigar_temp_unrolled[c_pos2];
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){
        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry(this->sequence1[q_pos1],this->sequence1.qualityChar(q_pos1),alignment.QueryBases[q_pos2],alignment.Qualities[q_pos2]);
            dna += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
        }
        if (c1 != 'I') ref_pos++;
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){
        c_pos1++;
        c_pos2++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {
        if (c1 == 'M'){
            nucigar += 'M';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){
        if(c1 == 'I'){
            nucigar += 'I';
            dna += this->sequence1[q_pos1];
            qualities += this->sequence1.qualityChar(q_pos1);
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  alignment.QueryBases[q_pos2];
            qualities += alignment.Qualities[q_pos2];
            c_pos2++;
            q_pos2++;
        }
    } else {
        assert(false);
    }
}